

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.h
# Opt level: O0

void __thiscall
dlib::con_<64l,3l,3l,1,1,1,1>::
backward<dlib::dimpl::subnet_wrapper<dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<64l,1l,1l,1,1,0,0>,dlib::add_tag_layer<1ul,dlib::impl::repeat_input_layer,void>,void>,void>,void>,true,void>>
          (con_<64L,_3L,_3L,_1,_1,_1,_1> *this,tensor *gradient_input,
          subnet_wrapper<dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_true,_void>
          *sub,tensor *params_grad)

{
  tensor_conv *this_00;
  tensor *grad;
  long in_RDI;
  alias_tensor_instance b;
  alias_tensor_instance filt;
  size_t in_stack_00000128;
  tensor *in_stack_00000130;
  tensor *in_stack_fffffffffffffea8;
  tensor *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  undefined1 add_to_output;
  tensor_conv *in_stack_fffffffffffffec0;
  
  add_to_output = (undefined1)((ulong)in_stack_fffffffffffffeb8 >> 0x38);
  alias_tensor::operator()((alias_tensor *)params_grad,in_stack_00000130,in_stack_00000128);
  dimpl::
  subnet_wrapper<dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_true,_void>
  ::get_gradient_input
            ((subnet_wrapper<dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_true,_void>
              *)0x20bb17);
  tt::tensor_conv::get_gradient_for_data
            (in_stack_fffffffffffffec0,(bool)add_to_output,in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffea8,(tensor *)0x20bb3f);
  alias_tensor_instance::~alias_tensor_instance((alias_tensor_instance *)0x20bb4e);
  if ((*(double *)(in_RDI + 0x148) != 0.0) || (NAN(*(double *)(in_RDI + 0x148)))) {
    alias_tensor::operator()((alias_tensor *)params_grad,in_stack_00000130,in_stack_00000128);
    this_00 = (tensor_conv *)(in_RDI + 0x128);
    dimpl::
    subnet_wrapper<dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_true,_void>
    ::get_output((subnet_wrapper<dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_true,_void>
                  *)0x20bbbb);
    tt::tensor_conv::get_gradient_for_filters
              (this_00,(bool)add_to_output,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               (tensor *)0x20bbe0);
    if ((*(byte *)(in_RDI + 0x178) & 1) != 0) {
      grad = (tensor *)(in_RDI + 0xe0);
      alias_tensor::size((alias_tensor *)(in_RDI + 0x98));
      alias_tensor::operator()((alias_tensor *)params_grad,in_stack_00000130,in_stack_00000128);
      tt::assign_conv_bias_gradient(grad,in_stack_fffffffffffffea8);
      alias_tensor_instance::~alias_tensor_instance((alias_tensor_instance *)0x20bc57);
    }
    alias_tensor_instance::~alias_tensor_instance((alias_tensor_instance *)0x20bcbf);
  }
  return;
}

Assistant:

void backward(const tensor& gradient_input, SUBNET& sub, tensor& params_grad)
        {
            conv.get_gradient_for_data (true, gradient_input, filters(params,0), sub.get_gradient_input());
            // no point computing the parameter gradients if they won't be used.
            if (learning_rate_multiplier != 0)
            {
                auto filt = filters(params_grad,0);
                conv.get_gradient_for_filters (false, gradient_input, sub.get_output(), filt);
                if (use_bias)
                {
                    auto b = biases(params_grad, filters.size());
                    tt::assign_conv_bias_gradient(b, gradient_input);
                }
            }
        }